

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

module_ pybind11::module_::create_extension_module
                  (char *name,char *doc,module_def *def,mod_gil_not_used gil_not_used)

{
  module_def *pmVar1;
  long lVar2;
  error_already_set *this;
  undefined7 in_register_00000009;
  
  *(undefined8 *)CONCAT71(in_register_00000009,gil_not_used.flag_) = 1;
  *(undefined8 *)(CONCAT71(in_register_00000009,gil_not_used.flag_) + 8) = 0;
  *(undefined8 *)(CONCAT71(in_register_00000009,gil_not_used.flag_) + 0x10) = 0;
  *(undefined8 *)(CONCAT71(in_register_00000009,gil_not_used.flag_) + 0x18) = 0;
  *(undefined8 *)(CONCAT71(in_register_00000009,gil_not_used.flag_) + 0x20) = 0;
  *(char **)(CONCAT71(in_register_00000009,gil_not_used.flag_) + 0x28) = doc;
  pmVar1 = (module_def *)0x0;
  if (options::global_state()::instance != '\0') {
    pmVar1 = def;
  }
  *(module_def **)(CONCAT71(in_register_00000009,gil_not_used.flag_) + 0x30) = pmVar1;
  *(undefined8 *)(CONCAT71(in_register_00000009,gil_not_used.flag_) + 0x38) = 0xffffffffffffffff;
  *(undefined8 *)(CONCAT71(in_register_00000009,gil_not_used.flag_) + 0x40) = 0;
  *(undefined8 *)(CONCAT71(in_register_00000009,gil_not_used.flag_) + 0x48) = 0;
  *(undefined8 *)(CONCAT71(in_register_00000009,gil_not_used.flag_) + 0x50) = 0;
  *(undefined8 *)(CONCAT71(in_register_00000009,gil_not_used.flag_) + 0x58) = 0;
  *(undefined8 *)(CONCAT71(in_register_00000009,gil_not_used.flag_) + 0x60) = 0;
  lVar2 = PyModule_Create2(CONCAT71(in_register_00000009,gil_not_used.flag_),0x3f5);
  if (lVar2 != 0) {
    *(long *)name = lVar2;
    handle::inc_ref((handle *)name);
    return (object)(object)name;
  }
  lVar2 = PyErr_Occurred();
  if (lVar2 == 0) {
    pybind11_fail("Internal error in module_::create_extension_module()");
  }
  this = (error_already_set *)__cxa_allocate_exception(0x18);
  error_already_set::error_already_set(this);
  __cxa_throw(this,&error_already_set::typeinfo,error_already_set::~error_already_set);
}

Assistant:

static module_ create_extension_module(const char *name,
                                           const char *doc,
                                           module_def *def,
                                           mod_gil_not_used gil_not_used
                                           = mod_gil_not_used(false)) {
        // module_def is PyModuleDef
        // Placement new (not an allocation).
        def = new (def)
            PyModuleDef{/* m_base */ PyModuleDef_HEAD_INIT,
                        /* m_name */ name,
                        /* m_doc */ options::show_user_defined_docstrings() ? doc : nullptr,
                        /* m_size */ -1,
                        /* m_methods */ nullptr,
                        /* m_slots */ nullptr,
                        /* m_traverse */ nullptr,
                        /* m_clear */ nullptr,
                        /* m_free */ nullptr};
        auto *m = PyModule_Create(def);
        if (m == nullptr) {
            if (PyErr_Occurred()) {
                throw error_already_set();
            }
            pybind11_fail("Internal error in module_::create_extension_module()");
        }
        if (gil_not_used.flag()) {
#ifdef Py_GIL_DISABLED
            PyUnstable_Module_SetGIL(m, Py_MOD_GIL_NOT_USED);
#endif
        }
        // TODO: Should be reinterpret_steal for Python 3, but Python also steals it again when
        //       returned from PyInit_...
        //       For Python 2, reinterpret_borrow was correct.
        return reinterpret_borrow<module_>(m);
    }